

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper.cpp
# Opt level: O3

CDBIterator * __thiscall CDBWrapper::NewIterator(CDBWrapper *this)

{
  DB *pDVar1;
  int iVar2;
  CDBIterator *this_00;
  unique_ptr<LevelDBContext,_std::default_delete<LevelDBContext>_> *puVar3;
  undefined4 extraout_var;
  long in_FS_OFFSET;
  __uniq_ptr_impl<CDBIterator::IteratorImpl,_std::default_delete<CDBIterator::IteratorImpl>_>
  local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (CDBIterator *)operator_new(0x10);
  puVar3 = inline_assertion_check<true,std::unique_ptr<LevelDBContext,std::default_delete<LevelDBContext>>const&>
                     (&this->m_db_context,
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.h"
                      ,0xd3,"DBContext","m_db_context");
  pDVar1 = ((puVar3->_M_t).
            super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>._M_t.
            super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
            super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl)->pdb;
  puVar3 = inline_assertion_check<true,std::unique_ptr<LevelDBContext,std::default_delete<LevelDBContext>>const&>
                     (&this->m_db_context,
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.h"
                      ,0xd3,"DBContext","m_db_context");
  iVar2 = (*pDVar1->_vptr_DB[6])
                    (pDVar1,&((puVar3->_M_t).
                              super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>
                              .super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl)->
                             iteroptions);
  local_28._M_t.
  super__Tuple_impl<0UL,_CDBIterator::IteratorImpl_*,_std::default_delete<CDBIterator::IteratorImpl>_>
  .super__Head_base<0UL,_CDBIterator::IteratorImpl_*,_false>._M_head_impl =
       (tuple<CDBIterator::IteratorImpl_*,_std::default_delete<CDBIterator::IteratorImpl>_>)
       operator_new(8);
  *(ulong *)local_28._M_t.
            super__Tuple_impl<0UL,_CDBIterator::IteratorImpl_*,_std::default_delete<CDBIterator::IteratorImpl>_>
            .super__Head_base<0UL,_CDBIterator::IteratorImpl_*,_false>._M_head_impl =
       CONCAT44(extraout_var,iVar2);
  CDBIterator::CDBIterator
            (this_00,this,
             (unique_ptr<CDBIterator::IteratorImpl,_std::default_delete<CDBIterator::IteratorImpl>_>
             )&local_28);
  std::unique_ptr<CDBIterator::IteratorImpl,_std::default_delete<CDBIterator::IteratorImpl>_>::
  ~unique_ptr((unique_ptr<CDBIterator::IteratorImpl,_std::default_delete<CDBIterator::IteratorImpl>_>
               *)&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return this_00;
  }
  __stack_chk_fail();
}

Assistant:

CDBIterator* CDBWrapper::NewIterator()
{
    return new CDBIterator{*this, std::make_unique<CDBIterator::IteratorImpl>(DBContext().pdb->NewIterator(DBContext().iteroptions))};
}